

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O0

bool intgemm::anon_unknown_0::Test<intgemm::AVX512BW::Kernels16>
               (float *input_unaligned,float quant_mult,size_t size)

{
  bool bVar1;
  float *__dest;
  IResultCapture *pIVar2;
  ulong in_RSI;
  void *in_RDI;
  int16_t *unaff_retaddr;
  float *in_stack_00000008;
  size_t i;
  AlignedVector<short> test;
  AlignedVector<short> ref;
  AlignedVector<float> input;
  bool success;
  undefined4 in_stack_fffffffffffffe58;
  short in_stack_fffffffffffffe5c;
  short in_stack_fffffffffffffe5e;
  float in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  byte bVar3;
  MessageBuilder *in_stack_fffffffffffffe68;
  OfType type;
  MessageBuilder *in_stack_fffffffffffffe70;
  MessageBuilder *in_stack_fffffffffffffe78;
  MessageBuilder *in_stack_fffffffffffffe80;
  int16_t *in_stack_fffffffffffffe88;
  float *in_stack_fffffffffffffe90;
  SourceLineInfo local_e8;
  StringRef local_d8;
  size_t local_68;
  AlignedVector<short> local_60 [2];
  AlignedVector<short> local_40;
  AlignedVector<float> local_30;
  byte local_19;
  ulong local_18;
  
  local_19 = 1;
  local_18 = in_RSI;
  AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  __dest = AlignedVector<float>::begin(&local_30);
  memcpy(__dest,in_RDI,local_18 << 2);
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  AlignedVector<short>::AlignedVector
            ((AlignedVector<short> *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  AlignedVector<float>::begin(&local_30);
  AlignedVector<short>::begin(&local_40);
  QuantizeRef(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
              (float)((ulong)in_stack_fffffffffffffe80 >> 0x20),(size_t)in_stack_fffffffffffffe78);
  AlignedVector<float>::begin(&local_30);
  AlignedVector<short>::begin(local_60);
  AVX512BW::Kernels16::Quantize
            (in_stack_00000008,unaff_retaddr,(float)((ulong)in_RDI >> 0x20),(Index)in_RDI);
  for (local_68 = 0; local_68 < local_18; local_68 = local_68 + 1) {
    AlignedVector<float>::operator[](&local_30,local_68);
    AlignedVector<short>::operator[](&local_40,local_68);
    AlignedVector<short>::operator[](local_60,local_68);
    bVar1 = IsOff<short>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e,
                         in_stack_fffffffffffffe5c);
    type = (OfType)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if (bVar1) {
      pIVar2 = Catch::getResultCapture();
      local_d8 = operator____catch_sr
                           ((char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            CONCAT26(in_stack_fffffffffffffe5e,
                                     CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)))
      ;
      Catch::SourceLineInfo::SourceLineInfo
                (&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/quantize_test.cc"
                 ,0x5f);
      Catch::MessageBuilder::MessageBuilder
                (in_stack_fffffffffffffe80,(StringRef *)in_stack_fffffffffffffe78,
                 (SourceLineInfo *)in_stack_fffffffffffffe70,type);
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (char (*) [10])
                 CONCAT26(in_stack_fffffffffffffe5e,
                          CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (unsigned_long *)
                 CONCAT26(in_stack_fffffffffffffe5e,
                          CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (char (*) [7])
                 CONCAT26(in_stack_fffffffffffffe5e,
                          CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      AlignedVector<float>::operator[](&local_30,local_68);
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (float *)CONCAT26(in_stack_fffffffffffffe5e,
                                   CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (char *)CONCAT26(in_stack_fffffffffffffe5e,
                                  CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (float *)CONCAT26(in_stack_fffffffffffffe5e,
                                   CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (char *)CONCAT26(in_stack_fffffffffffffe5e,
                                  CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      AlignedVector<float>::operator[](&local_30,local_68);
      Catch::MessageBuilder::operator<<
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (float *)CONCAT26(in_stack_fffffffffffffe5e,
                                   CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      in_stack_fffffffffffffe80 =
           Catch::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (char (*) [8])
                      CONCAT26(in_stack_fffffffffffffe5e,
                               CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      AlignedVector<short>::operator[](&local_40,local_68);
      in_stack_fffffffffffffe78 =
           Catch::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int *)CONCAT26(in_stack_fffffffffffffe5e,
                                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
                     );
      in_stack_fffffffffffffe70 =
           Catch::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (char (*) [9])
                      CONCAT26(in_stack_fffffffffffffe5e,
                               CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
      AlignedVector<short>::operator[](local_60,local_68);
      in_stack_fffffffffffffe68 =
           Catch::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int *)CONCAT26(in_stack_fffffffffffffe5e,
                                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
                     );
      (*pIVar2->_vptr_IResultCapture[8])(pIVar2,in_stack_fffffffffffffe68);
      Catch::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_19 = 0;
    }
  }
  bVar3 = local_19;
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x256f44);
  AlignedVector<short>::~AlignedVector((AlignedVector<short> *)0x256f51);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x256f5e);
  return (bool)(bVar3 & 1);
}

Assistant:

bool Test(const float *input_unaligned, float quant_mult, std::size_t size) {
  using Integer = typename Backend::Integer;
  bool success = true;
  AlignedVector<float> input(size);
  std::memcpy(input.begin(), input_unaligned, sizeof(float) * size);

  AlignedVector<Integer> ref(size);
  AlignedVector<Integer> test(size);
  QuantizeRef(input.begin(), ref.begin(), quant_mult, static_cast<Index>(size));
  Backend::Quantize(input.begin(), test.begin(), quant_mult, static_cast<Index>(size));
  for (std::size_t i = 0; i < size; ++i) {
    if (IsOff(input[i] * quant_mult, ref[i], test[i])) {
      UNSCOPED_INFO("Error at " << i << " from " << input[i] << '*' << quant_mult << '=' << (input[i]*quant_mult) << " ref = " << static_cast<int>(ref[i]) << " test = " << static_cast<int>(test[i]));
      success = false;
    }
  }
  return success;
}